

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9GlaShrink(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_44;
  int fVerbose;
  int c;
  int nTimeOut;
  int nFrameMax;
  int fUseBdd;
  int fUseSat;
  int fUsePdr;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseBdd = 0;
  nFrameMax = 1;
  nTimeOut = 0;
  c = 0;
  fVerbose = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_00279e94:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FTpsbvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9GlaShrink(): There is no AIG.\n");
        return 1;
      }
      if (pAbc->pGia->vGateClasses == (Vec_Int_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9GlaShrink(): There is no gate-level abstraction.\n");
        return 0;
      }
      Gia_ManShrinkGla(pAbc->pGia,c,fVerbose,fUseBdd,nFrameMax,nTimeOut,local_44);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0027a072;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    default:
      goto LAB_0027a072;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_0027a072;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar1 = fVerbose;
      break;
    case 0x62:
      nTimeOut = nTimeOut ^ 1;
      goto LAB_00279e94;
    case 0x68:
      goto LAB_0027a072;
    case 0x70:
      fUseBdd = fUseBdd ^ 1;
      goto LAB_00279e94;
    case 0x73:
      nFrameMax = nFrameMax ^ 1;
      goto LAB_00279e94;
    case 0x76:
      local_44 = local_44 ^ 1;
      goto LAB_00279e94;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0027a072:
      Abc_Print(-2,"usage: &gla_shrink [-FT num] [-psbvh]\n");
      Abc_Print(-2,"\t         shrinks the abstraction by removing redundant objects\n");
      Abc_Print(-2,"\t-F num : the maximum timeframe to check to [default = %d]\n",(ulong)(uint)c);
      Abc_Print(-2,"\t-T num : the timeout per call, in seconds [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar2 = "no";
      if (fUseBdd != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle using PDR for checking [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (nFrameMax != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle using BMC for checking [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (nTimeOut != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle using BDDs for checking [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_44 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GlaShrink( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int fUsePdr = 0;
    int fUseSat = 1;
    int fUseBdd = 0;
    int nFrameMax = 0;
    int nTimeOut = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTpsbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrameMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrameMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'p':
            fUsePdr ^= 1;
            break;
        case 's':
            fUseSat ^= 1;
            break;
        case 'b':
            fUseBdd ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaShrink(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->vGateClasses == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaShrink(): There is no gate-level abstraction.\n" );
        return 0;
    }
    Gia_ManShrinkGla( pAbc->pGia, nFrameMax, nTimeOut, fUsePdr, fUseSat, fUseBdd, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_shrink [-FT num] [-psbvh]\n" );
    Abc_Print( -2, "\t         shrinks the abstraction by removing redundant objects\n" );
    Abc_Print( -2, "\t-F num : the maximum timeframe to check to [default = %d]\n", nFrameMax );
    Abc_Print( -2, "\t-T num : the timeout per call, in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-p     : toggle using PDR for checking [default = %s]\n", fUsePdr? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using BMC for checking [default = %s]\n", fUseSat? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using BDDs for checking [default = %s]\n", fUseBdd? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}